

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthRangeTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::DepthRangeWriteCase::DepthRangeWriteCase
          (DepthRangeWriteCase *this,Context *context,char *name,char *desc,Vec4 *depthCoord,
          float zNear,float zFar)

{
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,desc);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DepthRangeWriteCase_0078f540;
  this->m_depthCoord = depthCoord;
  this->m_zNear = zNear;
  this->m_zFar = zFar;
  return;
}

Assistant:

DepthRangeWriteCase::DepthRangeWriteCase (Context& context, const char* name, const char* desc, const tcu::Vec4& depthCoord, const float zNear, const float zFar)
	: TestCase			(context, name, desc)
	, m_depthCoord		(depthCoord)
	, m_zNear			(zNear)
	, m_zFar			(zFar)
{
}